

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::unhandled(parser *this,char *function,int line)

{
  ostream *poVar1;
  runtime_error *this_00;
  string asStack_1b8 [32];
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Unhandled token in ");
  poVar1 = std::operator<<(poVar1,function);
  poVar1 = std::operator<<(poVar1," line ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  poVar1 = std::operator<<(poVar1," ");
  mjs::operator<<(poVar1,&this->current_token_);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void unhandled(const char* function, int line) {
        std::ostringstream oss;
        oss << "Unhandled token in " << function  << " line " << line << " " << current_token();
        throw std::runtime_error(oss.str());
    }